

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O1

void writecode(uchar *block,aint length,unsigned_short loadaddr,bool header,FILE *fp)

{
  byte bVar1;
  uchar uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  
  if ((int)CONCAT71(in_register_00000009,header) != 0) {
    writeheader('\x03',"loader",(unsigned_short)length,loadaddr,0,fp);
  }
  writeword(length + 2,fp);
  parity = '\0';
  fputc(0xff,(FILE *)fp);
  parity = ~parity;
  if (0 < length) {
    uVar3 = 0;
    do {
      bVar1 = block[uVar3];
      fputc((uint)bVar1,(FILE *)fp);
      parity = parity ^ bVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  uVar2 = parity;
  fputc((uint)parity,(FILE *)fp);
  parity = parity ^ uVar2;
  return;
}

Assistant:

static void writecode(unsigned char* block, aint length, unsigned short loadaddr, bool header, FILE *fp) {
	if (header) {
		/* Filetype (3: Code) */
		writeheader(3, "loader", length, loadaddr, 0, fp);
	}

	/* Now onto the data bit */
	writeword(length + 2, fp);	/* Length of next block */
	parity = 0;
	writebyte(255, fp); /* Data... */
	for (aint i = 0; i < length; i++) {
		writebyte(block[i], fp);
	}
	writebyte(parity, fp);
}